

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O3

void Gia_Truth6ToGiaTest(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *vMap;
  int *piVar5;
  Vec_Int_t *vSupp;
  Vec_Int_t *pVVar6;
  Gia_Obj_t *pFanout;
  word wVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  int Id;
  int pVarLits [6];
  int local_68;
  uint local_64;
  long local_60;
  word local_58;
  ulong local_50;
  int local_48 [6];
  
  iVar1 = p->vCis->nSize;
  vMap = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar3 = iVar1;
  }
  vMap->nCap = iVar3;
  if (iVar3 == 0) {
    vMap->pArray = (int *)0x0;
    vMap->nSize = iVar1;
  }
  else {
    piVar5 = (int *)malloc((long)iVar3 << 2);
    vMap->pArray = piVar5;
    vMap->nSize = iVar1;
    if (piVar5 != (int *)0x0) {
      memset(piVar5,0xff,(long)iVar1 << 2);
    }
  }
  vSupp = (Vec_Int_t *)malloc(0x10);
  vSupp->nCap = 100;
  piVar5 = (int *)calloc(1,400);
  vSupp->pArray = piVar5;
  vSupp->nSize = 100;
  local_60 = (long)p->vCos->nSize;
  Gia_ManHashAlloc(p);
  pVVar6 = p->vCos;
  if (pVVar6->nSize < 1) {
    uVar10 = 0;
  }
  else {
    uVar13 = 0;
    uVar10 = 0;
    do {
      iVar1 = pVVar6->pArray[uVar13];
      if ((iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_0023784a:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      local_68 = iVar1;
      if (iVar1 == 0) break;
      Gia_ManCollectCis(p,&local_68,1,vSupp);
      if ((vSupp->nSize < 6) && ((long)uVar13 < local_60)) {
        if (0 < vSupp->nSize) {
          piVar5 = vSupp->pArray;
          lVar8 = 0;
          do {
            iVar1 = piVar5[lVar8];
            if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0023784a;
            if (-1 < (int)*(undefined8 *)(p->pObjs + iVar1)) goto LAB_00237888;
            uVar4 = (uint)((ulong)*(undefined8 *)(p->pObjs + iVar1) >> 0x20);
            if (vMap->nSize <= (int)(uVar4 & 0x1fffffff)) goto LAB_00237869;
            vMap->pArray[uVar4 & 0x1fffffff] = (int)lVar8;
            local_48[lVar8] = iVar1 * 2;
            lVar8 = lVar8 + 1;
          } while (lVar8 < vSupp->nSize);
        }
        local_50 = uVar13;
        local_58 = Gia_LutComputeTruth6Map(p,(int)uVar13,vMap);
        uVar4 = Gia_Truth5ToGia(p,local_48,vSupp->nSize,(uint)local_58,1);
        if (((int)uVar4 < 0) || (uVar12 = uVar4 >> 1, p->nObjs <= (int)uVar12)) {
          __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        local_64 = uVar10;
        if ((~*(uint *)(p->pObjs + uVar12) & 0x1fffffff) != 0 &&
            (int)*(uint *)(p->pObjs + uVar12) < 0) {
          __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        pFanout = Gia_ManAppendObj(p);
        uVar13 = *(ulong *)pFanout;
        *(ulong *)pFanout = uVar13 | 0x80000000;
        pGVar2 = p->pObjs;
        if ((pFanout < pGVar2) || (pGVar2 + p->nObjs <= pFanout)) {
LAB_002378a7:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar9 = (ulong)(((uint)((int)pFanout - (int)pGVar2) >> 2) * -0x55555555 - uVar12 &
                       0x1fffffff);
        uVar11 = (ulong)((uVar4 & 1) << 0x1d);
        *(ulong *)pFanout = uVar11 | uVar13 & 0xffffffffc0000000 | 0x80000000 | uVar9;
        *(ulong *)pFanout =
             uVar11 | uVar13 & 0xe0000000c0000000 | 0x80000000 | uVar9 |
             (ulong)(p->vCos->nSize & 0x1fffffff) << 0x20;
        pGVar2 = p->pObjs;
        if ((pFanout < pGVar2) || (pGVar2 + p->nObjs <= pFanout)) goto LAB_002378a7;
        Vec_IntPush(p->vCos,(int)((ulong)((long)pFanout - (long)pGVar2) >> 2) * -0x55555555);
        uVar13 = local_50;
        if (p->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(p,pFanout + -(ulong)((uint)*(undefined8 *)pFanout & 0x1fffffff),pFanout);
        }
        if ((pFanout < p->pObjs) || (p->pObjs + p->nObjs <= pFanout)) goto LAB_002378a7;
        wVar7 = Gia_LutComputeTruth6Map(p,p->vCos->nSize + -1,vMap);
        uVar10 = local_64;
        if (0 < vSupp->nSize) {
          piVar5 = vSupp->pArray;
          lVar8 = 0;
          do {
            iVar1 = piVar5[lVar8];
            if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0023784a;
            if (-1 < (int)*(undefined8 *)(p->pObjs + iVar1)) {
LAB_00237888:
              __assert_fail("pObj->fTerm",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
            }
            uVar4 = (uint)((ulong)*(undefined8 *)(p->pObjs + iVar1) >> 0x20);
            if (vMap->nSize <= (int)(uVar4 & 0x1fffffff)) {
LAB_00237869:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            vMap->pArray[uVar4 & 0x1fffffff] = -1;
            lVar8 = lVar8 + 1;
          } while (lVar8 < vSupp->nSize);
        }
        if (local_58 != wVar7) {
          printf("Error for output %d.\n",uVar13 & 0xffffffff);
        }
        uVar10 = uVar10 + 1;
      }
      uVar13 = uVar13 + 1;
      pVVar6 = p->vCos;
    } while ((long)uVar13 < (long)pVVar6->nSize);
  }
  Gia_ManHashStop(p);
  printf("Finished processing %d outputs.\n",(ulong)uVar10);
  if (vSupp->pArray != (int *)0x0) {
    free(vSupp->pArray);
  }
  free(vSupp);
  if (vMap->pArray != (int *)0x0) {
    free(vMap->pArray);
  }
  free(vMap);
  return;
}

Assistant:

void Gia_Truth6ToGiaTest( Gia_Man_t * p )
{
    int Size = 5;
    word Truth, TruthNew;
    Vec_Int_t * vMap = Vec_IntStartFull( Gia_ManCiNum(p) );
    Vec_Int_t * vSupp = Vec_IntStart( 100 );
    int nCos = Gia_ManCoNum(p), Count = 0;
    int i, k, Id, ObjId, iLitNew;
    Gia_ManHashAlloc( p );
    Gia_ManForEachCoId( p, Id, i )
    {
        Gia_ManCollectCis( p, &Id, 1, vSupp ); // ObjIds
        if ( Vec_IntSize(vSupp) <= Size && i < nCos )
        {
            int pVarLits[6];
            Vec_IntForEachEntry( vSupp, ObjId, k )
            {
                int CioId = Gia_ObjCioId(Gia_ManObj(p, ObjId));
                Vec_IntWriteEntry( vMap, CioId, k );
                pVarLits[k] = Abc_Var2Lit( ObjId, 0 );
            }
            Truth = Gia_LutComputeTruth6Map( p, i, vMap );
            if ( Size == 5 )
                iLitNew = Gia_Truth5ToGia( p, pVarLits, Vec_IntSize(vSupp), (unsigned)Truth, 1 );
            else
                iLitNew = Gia_Truth6ToGia( p, pVarLits, Vec_IntSize(vSupp), Truth, 1 );
            Gia_ManAppendCo( p, iLitNew );
            TruthNew = Gia_LutComputeTruth6Map( p, Gia_ManCoNum(p)-1, vMap );
            Vec_IntForEachEntry( vSupp, ObjId, k )
            {
                int CioId = Gia_ObjCioId(Gia_ManObj(p, ObjId));
                Vec_IntWriteEntry( vMap, CioId, -1 );
            }
            if ( Truth != TruthNew )
                printf( "Error for output %d.\n", i );
            Count++;
            //Dau_DsdPrintFromTruth( &Truth, Vec_IntSize(vSupp) );
        }
    }
    Gia_ManHashStop( p );
    printf( "Finished processing %d outputs.\n", Count );
    Vec_IntFree( vSupp );
    Vec_IntFree( vMap );
}